

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip-test.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_0::MockAsyncOutputStream::write
          (MockAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  long lVar1;
  ArrayPtr<const_unsigned_char> *__begin2;
  
  for (lVar1 = __n << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
    Vector<unsigned_char>::addAll<kj::ArrayPtr<unsigned_char_const>const&>
              ((Vector<unsigned_char> *)(CONCAT44(in_register_00000034,__fd) + 8),
               (ArrayPtr<const_unsigned_char> *)__buf);
    __buf = (void *)((long)__buf + 0x10);
  }
  Promise<void>::Promise((Promise<void> *)this);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    for (auto& piece: pieces) {
      bytes.addAll(piece);
    }
    return kj::READY_NOW;
  }